

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

void __thiscall
dxil_spv::Converter::Impl::emit_interpolation_decorations
          (Impl *this,Id variable_id,InterpolationMode mode)

{
  Builder *this_00;
  Decoration decoration;
  undefined7 in_register_00000011;
  Capability *__v;
  Capability CStack_28;
  Capability local_24;
  
  __v = &CStack_28;
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  switch((int)CONCAT71(in_register_00000011,mode)) {
  case 1:
    decoration = DecorationFlat;
    break;
  default:
    goto switchD_0011e53e_caseD_2;
  case 4:
    decoration = DecorationNoPerspective;
    break;
  case 5:
    spv::Builder::addDecoration(this_00,variable_id,DecorationNoPerspective,-1);
  case 3:
    decoration = DecorationCentroid;
    break;
  case 6:
    spv::Builder::addDecoration(this_00,variable_id,DecorationSample,-1);
    goto LAB_0011e5d0;
  case 7:
    spv::Builder::addDecoration(this_00,variable_id,DecorationNoPerspective,-1);
    spv::Builder::addDecoration(this_00,variable_id,DecorationSample,-1);
    __v = &local_24;
LAB_0011e5d0:
    *__v = CapabilitySampleRateShading;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this_00->capabilities,__v);
    (this->execution_mode_meta).per_sample_shading = true;
switchD_0011e53e_caseD_2:
    return;
  }
  spv::Builder::addDecoration(this_00,variable_id,decoration,-1);
  return;
}

Assistant:

void Converter::Impl::emit_interpolation_decorations(spv::Id variable_id, DXIL::InterpolationMode mode)
{
	auto &builder = spirv_module.get_builder();
	switch (mode)
	{
	case DXIL::InterpolationMode::Constant:
		builder.addDecoration(variable_id, spv::DecorationFlat);
		break;

	case DXIL::InterpolationMode::LinearCentroid:
		builder.addDecoration(variable_id, spv::DecorationCentroid);
		break;

	case DXIL::InterpolationMode::LinearSample:
		builder.addDecoration(variable_id, spv::DecorationSample);
		builder.addCapability(spv::CapabilitySampleRateShading);
		execution_mode_meta.per_sample_shading = true;
		break;

	case DXIL::InterpolationMode::LinearNoperspective:
		builder.addDecoration(variable_id, spv::DecorationNoPerspective);
		break;

	case DXIL::InterpolationMode::LinearNoperspectiveCentroid:
		builder.addDecoration(variable_id, spv::DecorationNoPerspective);
		builder.addDecoration(variable_id, spv::DecorationCentroid);
		break;

	case DXIL::InterpolationMode::LinearNoperspectiveSample:
		builder.addDecoration(variable_id, spv::DecorationNoPerspective);
		builder.addDecoration(variable_id, spv::DecorationSample);
		builder.addCapability(spv::CapabilitySampleRateShading);
		execution_mode_meta.per_sample_shading = true;
		break;

	default:
		break;
	}
}